

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_HT_PHASOR_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000238;
  int *in_stack_00000240;
  int *in_stack_00000248;
  double *in_stack_00000250;
  int in_stack_0000025c;
  int in_stack_00000260;
  double *in_stack_00000270;
  
  TVar1 = TA_HT_PHASOR(in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_00000248,
                       in_stack_00000240,in_stack_00000238,in_stack_00000270);
  return TVar1;
}

Assistant:

TA_RetCode TA_HT_PHASOR_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_HT_PHASOR(
/* Generated */                   startIdx,
/* Generated */                   endIdx,
/* Generated */                   params->in[0].data.inReal, /* inReal */
/* Generated */                   outBegIdx, 
/* Generated */                   outNBElement, 
/* Generated */                   params->out[0].data.outReal, /*  outInPhase */
/* Generated */                   params->out[1].data.outReal /*  outQuadrature */ );
/* Generated */ }